

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.cc
# Opt level: O2

void __thiscall Sequence::read_files(Sequence *this)

{
  vector<int,_std::allocator<int>_> *this_00;
  pointer piVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  reference pvVar5;
  int it;
  long lVar6;
  __shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2> *p_Var7;
  long lVar8;
  float fVar9;
  int maxitemsup;
  __shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  fVar9 = ((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          avg_trans_count * 30.0;
  uVar4 = (ulong)fVar9;
  this_00 = (this->numLargeItemset).
            super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  piVar1 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = piVar1;
  }
  std::vector<int,_std::allocator<int>_>::resize
            (this_00,(long)(fVar9 - 9.223372e+18) & (long)uVar4 >> 0x3f | uVar4);
  iVar2 = InvertDatabase::make_l1_pass
                    ((this->invdb).super___shared_ptr<InvertDatabase,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  pvVar5 = std::vector<int,_std::allocator<int>_>::at
                     ((this->numLargeItemset).
                      super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,0);
  *pvVar5 = iVar2;
  if (((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      ext_l2_pass == 0) {
    iVar2 = get_file_l2(this);
  }
  else {
    iVar2 = InvertDatabase::make_l2_pass
                      ((this->invdb).super___shared_ptr<InvertDatabase,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
  }
  pvVar5 = std::vector<int,_std::allocator<int>_>::at
                     ((this->numLargeItemset).
                      super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,1);
  *pvVar5 = iVar2;
  lVar8 = 0;
  for (lVar6 = 0;
      uVar4 = (ulong)((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->dbase_max_item, lVar6 < (long)uVar4; lVar6 = lVar6 + 1) {
    p_Var7 = *(__shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2> **)
              ((long)&((((this->invdb).
                         super___shared_ptr<InvertDatabase,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       eqgraph).
                       super__Vector_base<std::shared_ptr<EqGrNode>,_std::allocator<std::shared_ptr<EqGrNode>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                      super___shared_ptr<EqGrNode,_(__gnu_cxx::_Lock_policy)2> + lVar8);
    if (p_Var7 != (__shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if ((p_Var7->_M_ptr != (element_type *)0x0) && (0 < p_Var7->_M_ptr->theSize)) {
        std::__shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_40,p_Var7);
        Array::compact(local_40._M_ptr);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
        p_Var7 = *(__shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2> **)
                  ((long)&((((this->invdb).
                             super___shared_ptr<InvertDatabase,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                           ->eqgraph).
                           super__Vector_base<std::shared_ptr<EqGrNode>,_std::allocator<std::shared_ptr<EqGrNode>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<EqGrNode,_(__gnu_cxx::_Lock_policy)2> + lVar8);
      }
      if ((p_Var7[1]._M_ptr != (element_type *)0x0) && (0 < (p_Var7[1]._M_ptr)->theSize)) {
        std::__shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_40,p_Var7 + 1);
        Array::compact(local_40._M_ptr);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      }
    }
    lVar8 = lVar8 + 0x10;
  }
  iVar2 = 0;
  for (it = 0; it < (int)uVar4; it = it + 1) {
    iVar3 = Partition::partition_get_idxsup
                      ((this->partition).super___shared_ptr<Partition,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,it);
    if (iVar2 < iVar3) {
      iVar2 = iVar3;
    }
    uVar4 = (ulong)(uint)((this->args).
                          super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         dbase_max_item;
  }
  std::make_shared<Array,int&>((int *)&local_40);
  std::__shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->l_array).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>,&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  std::make_shared<Array,int&>((int *)&local_40);
  std::__shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->e_array).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>,&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  std::make_shared<Array,int&>((int *)&local_40);
  std::__shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_array).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>,&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  return;
}

Assistant:

void Sequence::read_files() {
    int i;
    auto capacity = static_cast<unsigned long>(args->avg_trans_count * 30);

    numLargeItemset->clear();
    numLargeItemset->resize(capacity);

    numLargeItemset->at(0) = invdb->make_l1_pass();

    if (args->ext_l2_pass) {
        numLargeItemset->at(1) = invdb->make_l2_pass();
    } else {
        numLargeItemset->at(1) = get_file_l2();
    }

    for (i = 0; i < args->dbase_max_item; i++) {
        if (invdb->get_eqgraph_item(i)) {
            if (invdb->get_eqgraph_item(i)->num_elements() > 0)
                invdb->get_eqgraph_item(i)->elements()->compact();
            if (invdb->get_eqgraph_item(i)->seqnum_elements() > 0)
                invdb->get_eqgraph_item(i)->seqelements()->compact();
        }
    }

    int maxitemsup = 0;
    int sup;
    for (i = 0; i < args->dbase_max_item; i++) {
        sup = partition->partition_get_idxsup(i);
        if (maxitemsup < sup) maxitemsup = sup;
    }
    l_array = make_shared<Array>(maxitemsup);
    e_array = make_shared<Array>(maxitemsup);
    m_array = make_shared<Array>(maxitemsup);
}